

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix4 * matrix4_inverse(matrix4 *self,matrix4 *mR)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  matrix4 inverse;
  float local_d8 [50];
  
  fVar17 = matrix4_determinant(self);
  fVar18 = -fVar17;
  if (-fVar17 <= fVar17) {
    fVar18 = fVar17;
  }
  if (fVar18 < 1e-05) {
    mR = (matrix4 *)0x0;
  }
  else {
    fVar18 = (self->field_0).m[10];
    fVar1 = (self->field_0).m[5];
    fVar2 = (self->field_0).m[6];
    fVar3 = (self->field_0).m[0xf];
    fVar4 = (self->field_0).m[0xb];
    fVar5 = (self->field_0).m[0xd];
    fVar6 = (self->field_0).m[7];
    fVar7 = (self->field_0).m[9];
    fVar8 = (self->field_0).m[0xe];
    local_d8[0] = (((fVar6 * fVar7 * fVar8 + fVar1 * fVar18 * fVar3 + fVar2 * fVar4 * fVar5) -
                   fVar1 * fVar4 * fVar8) - fVar2 * fVar7 * fVar3) - fVar18 * fVar6 * fVar5;
    fVar9 = (self->field_0).m[1];
    fVar10 = (self->field_0).m[2];
    fVar11 = (self->field_0).m[3];
    fVar22 = -fVar9;
    fVar19 = -fVar10;
    fVar20 = -fVar11;
    local_d8[2] = fVar2 * fVar20 * fVar5 +
                  fVar1 * fVar19 * fVar3 +
                  fVar6 * fVar22 * fVar8 +
                  fVar1 * fVar11 * fVar8 + fVar2 * fVar9 * fVar3 + fVar5 * fVar6 * fVar10;
    local_d8[1] = (((fVar18 * fVar11 * fVar5 + fVar4 * fVar9 * fVar8 + fVar3 * fVar7 * fVar10) -
                   fVar18 * fVar9 * fVar3) - fVar4 * fVar10 * fVar5) - fVar7 * fVar11 * fVar8;
    fVar12 = (self->field_0).m[4];
    fVar13 = (self->field_0).m[8];
    fVar14 = (self->field_0).m[0xc];
    local_d8[4] = (((fVar18 * fVar6 * fVar14 + fVar4 * fVar12 * fVar8 + fVar3 * fVar2 * fVar13) -
                   fVar18 * fVar12 * fVar3) - fVar2 * fVar4 * fVar14) - fVar6 * fVar13 * fVar8;
    local_d8[3] = fVar1 * fVar20 * fVar18 +
                  fVar6 * fVar19 * fVar7 +
                  fVar2 * fVar22 * fVar4 +
                  fVar2 * fVar11 * fVar7 + fVar6 * fVar9 * fVar18 + fVar4 * fVar1 * fVar10;
    fVar15 = (self->field_0).m[0];
    local_d8[5] = (((fVar11 * fVar13 * fVar8 + fVar18 * fVar15 * fVar3 + fVar4 * fVar10 * fVar14) -
                   fVar4 * fVar15 * fVar8) - fVar10 * fVar13 * fVar3) - fVar18 * fVar11 * fVar14;
    fVar21 = -fVar15;
    local_d8[7] = fVar2 * fVar20 * fVar13 +
                  fVar19 * fVar12 * fVar4 +
                  fVar6 * fVar21 * fVar18 +
                  fVar11 * fVar12 * fVar18 + fVar2 * fVar15 * fVar4 + fVar6 * fVar10 * fVar13;
    local_d8[6] = fVar20 * fVar12 * fVar8 +
                  fVar6 * fVar19 * fVar14 +
                  fVar2 * fVar21 * fVar3 +
                  fVar2 * fVar11 * fVar14 + fVar6 * fVar15 * fVar8 + fVar3 * fVar10 * fVar12;
    local_d8[9] = (((fVar7 * fVar11 * fVar14 + fVar4 * fVar15 * fVar5 + fVar3 * fVar9 * fVar13) -
                   fVar7 * fVar15 * fVar3) - fVar4 * fVar9 * fVar14) - fVar11 * fVar13 * fVar5;
    local_d8[8] = (((fVar6 * fVar13 * fVar5 + fVar7 * fVar12 * fVar3 + fVar1 * fVar4 * fVar14) -
                   fVar4 * fVar12 * fVar5) - fVar1 * fVar13 * fVar3) - fVar6 * fVar7 * fVar14;
    local_d8[10] = fVar1 * fVar20 * fVar14 +
                   fVar3 * fVar22 * fVar12 +
                   fVar6 * fVar21 * fVar5 +
                   fVar11 * fVar12 * fVar5 + fVar15 * fVar1 * fVar3 + fVar6 * fVar9 * fVar14;
    local_d8[0xc] =
         (((fVar2 * fVar7 * fVar14 + fVar18 * fVar12 * fVar5 + fVar1 * fVar13 * fVar8) -
          fVar7 * fVar12 * fVar8) - fVar1 * fVar18 * fVar14) - fVar2 * fVar13 * fVar5;
    local_d8[0xb] =
         fVar20 * fVar12 * fVar7 +
         fVar6 * fVar22 * fVar13 +
         fVar4 * fVar21 * fVar1 +
         fVar1 * fVar11 * fVar13 + fVar6 * fVar15 * fVar7 + fVar4 * fVar9 * fVar12;
    local_d8[0xe] =
         fVar19 * fVar12 * fVar5 +
         fVar2 * fVar22 * fVar14 +
         fVar21 * fVar1 * fVar8 +
         fVar1 * fVar10 * fVar14 + fVar2 * fVar15 * fVar5 + fVar9 * fVar12 * fVar8;
    local_d8[0xd] =
         (((fVar10 * fVar13 * fVar5 + fVar7 * fVar15 * fVar8 + fVar18 * fVar9 * fVar14) -
          fVar18 * fVar15 * fVar5) - fVar9 * fVar13 * fVar8) - fVar7 * fVar10 * fVar14;
    local_d8[0xf] =
         fVar1 * fVar19 * fVar13 +
         fVar22 * fVar12 * fVar18 +
         fVar2 * fVar21 * fVar7 +
         fVar10 * fVar12 * fVar7 + fVar15 * fVar1 * fVar18 + fVar2 * fVar9 * fVar13;
    lVar16 = 0;
    do {
      (mR->field_0).m[lVar16] = local_d8[lVar16] * (1.0 / fVar17);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x10);
  }
  return mR;
}

Assistant:

HYPAPI struct matrix4 *matrix4_inverse(const struct matrix4 *self, struct matrix4 *mR)
{
	struct matrix4 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix4_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	matrix4_identity(&inverse);

	B(11) = A3(22, 33, 44) + A3(23, 34, 42) + A3(24, 32, 43) - A3(22, 34, 43) - A3(23, 32, 44) - A3(24, 33, 42);
	B(12) = A3(12, 34, 43) + A3(13, 32, 44) + A3(14, 33, 42) - A3(12, 33, 44) - A3(13, 34, 42) - A3(14, 32, 43);
	B(13) = A3(12, 23, 44) + A3(13, 24, 42) + A3(14, 22, 43) - A3(12, 24, 43) - A3(13, 22, 44) - A3(14, 23, 42);
	B(14) = A3(12, 24, 33) + A3(13, 22, 34) + A3(14, 23, 32) - A3(12, 23, 34) - A3(13, 24, 32) - A3(14, 22, 33);
	B(21) = A3(21, 34, 43) + A3(23, 31, 44) + A3(24, 33, 41) - A3(21, 33, 44) - A3(23, 34, 41) - A3(24, 31, 43);
	B(22) = A3(11, 33, 44) + A3(13, 34, 41) + A3(14, 31, 43) - A3(11, 34, 43) - A3(13, 31, 44) - A3(14, 33, 41);
	B(23) = A3(11, 24, 43) + A3(13, 21, 44) + A3(14, 23, 41) - A3(11, 23, 44) - A3(13, 24, 41) - A3(14, 21, 43);
	B(24) = A3(11, 23, 34) + A3(13, 24, 31) + A3(14, 21, 33) - A3(11, 24, 33) - A3(13, 21, 34) - A3(14, 23, 31);
	B(31) = A3(21, 32, 44) + A3(22, 34, 41) + A3(24, 31, 42) - A3(21, 34, 42) - A3(22, 31, 44) - A3(24, 32, 41);
	B(32) = A3(11, 34, 42) + A3(12, 31, 44) + A3(14, 32, 41) - A3(11, 32, 44) - A3(12, 34, 41) - A3(14, 31, 42);
	B(33) = A3(11, 22, 44) + A3(12, 24, 41) + A3(14, 21, 42) - A3(11, 24, 42) - A3(12, 21, 44) - A3(14, 22, 41);
	B(34) = A3(11, 24, 32) + A3(12, 21, 34) + A3(14, 22, 31) - A3(11, 22, 34) - A3(12, 24, 31) - A3(14, 21, 32);
	B(41) = A3(21, 33, 42) + A3(22, 31, 43) + A3(23, 32, 41) - A3(21, 32, 43) - A3(22, 33, 41) - A3(23, 31, 42);
	B(42) = A3(11, 32, 43) + A3(12, 33, 41) + A3(13, 31, 42) - A3(11, 33, 42) - A3(12, 31, 43) - A3(13, 32, 41);
	B(43) = A3(11, 23, 42) + A3(12, 21, 43) + A3(13, 22, 41) - A3(11, 22, 43) - A3(12, 23, 41) - A3(13, 21, 42);
	B(44) = A3(11, 22, 33) + A3(12, 23, 31) + A3(13, 21, 32) - A3(11, 23, 32) - A3(12, 21, 33) - A3(13, 22, 31);

	/* divide the determinant */
	for (i = 0; i < 16; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}